

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get<std::array<float,2ul>>
          (Attribute *this,double t,array<float,_2UL> *dst,TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type *pvVar2;
  optional<std::array<float,_2UL>_> v;
  optional<std::array<float,_2UL>_> local_40;
  optional<std::array<float,_2UL>_> local_34;
  
  if (dst == (array<float,_2UL> *)0x0) {
    return false;
  }
  if (NAN(t)) {
    bVar1 = primvar::PrimVar::has_value(&this->_var);
    if (bVar1) {
      primvar::PrimVar::get_value<std::array<float,2ul>>(&local_40,&this->_var);
      local_34.has_value_ = local_40.has_value_;
      if (local_40.has_value_ != false) {
        local_34.contained = local_40.contained;
        pvVar2 = nonstd::optional_lite::optional<std::array<float,_2UL>_>::value(&local_34);
        *(undefined8 *)dst->_M_elems = *(undefined8 *)pvVar2->_M_elems;
        return true;
      }
    }
  }
  if ((this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar1 = get_value<std::array<float,2ul>>(this,dst);
  }
  else {
    bVar1 = primvar::PrimVar::get_interpolated_value<std::array<float,2ul>>
                      (&this->_var,t,tinterp,dst);
  }
  return bVar1;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }